

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::flags_internal::anon_unknown_0::ReadFlagsFromEnv
          (anon_unknown_0 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *flag_names,
          vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
          *input_args,bool fail_on_absent_in_env)

{
  pointer *ppbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer __first;
  pointer __last;
  _Alloc_hider _Var3;
  bool bVar4;
  char *pcVar5;
  _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
  *this_00;
  pointer __result;
  pointer pAVar6;
  pointer pbVar7;
  undefined7 in_register_00000009;
  AlphaNum *__alloc;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  size_t __n;
  bool bVar8;
  AlphaNum *__n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char local_174;
  string envval;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  AlphaNum local_130;
  AlphaNum local_100;
  AlphaNum local_d0;
  string envname;
  
  __alloc = (AlphaNum *)CONCAT71(in_register_00000009,fail_on_absent_in_env);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n_00 = (AlphaNum *)0x110317;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
             (char (*) [1])0x110317);
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
  pbVar2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8);
  bVar8 = true;
  pcVar5 = extraout_RDX;
  do {
    if (__lhs == pbVar2) {
      if (bVar8) {
        pbVar7 = (flag_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar7 == (flag_names->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_00 = (_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                     *)std::
                       vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                       ::_M_check_len((vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                                       *)flag_names,(size_type)__n_00,pcVar5);
          __first = (flag_names->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          __last = (flag_names->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          __result = (pointer)std::
                              _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                              ::_M_allocate(this_00,(size_t)__n_00);
          this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(((long)pbVar7 - (long)__first) + (long)__result);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(this_01,&args);
          this_01[1].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pAVar6 = std::
                   vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                   ::_S_relocate((pointer)__first,(pointer)pbVar7,(pointer)__result,
                                 (_Tp_alloc_type *)__alloc);
          pbVar7 = (pointer)std::
                            vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                            ::_S_relocate((pointer)pbVar7,(pointer)__last,pAVar6 + 1,
                                          (_Tp_alloc_type *)__alloc);
          std::
          _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
          ::_M_deallocate((_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                           *)__first,
                          (pointer)((long)(flag_names->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)__first >> 5),__n);
          (flag_names->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = __result;
          (flag_names->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar7;
          (flag_names->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pbVar7,&args);
          *(undefined8 *)((long)&pbVar7->field_2 + 8) = 0;
          ppbVar1 = &(flag_names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppbVar1 = *ppbVar1 + 1;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&args);
      return bVar8;
    }
    bVar4 = std::operator==(__lhs,"fromenv");
    if (bVar4) {
LAB_0010cf08:
      local_100.piece_ = NullSafeStringView("Infinite recursion on flag ");
      __alloc = (AlphaNum *)__lhs->_M_string_length;
      local_130.piece_._M_str = (__lhs->_M_dataplus)._M_p;
      local_130.piece_._M_len = (size_t)__alloc;
      absl::lts_20240722::StrCat_abi_cxx11_(&local_d0,&local_100);
      __n_00 = (AlphaNum *)local_d0.piece_._M_len;
      absl::lts_20240722::flags_internal::ReportUsageError
                (local_d0.piece_._M_str,local_d0.piece_._M_len,1);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar8 = false;
      pcVar5 = extraout_RDX_00;
    }
    else {
      bVar4 = std::operator==(__lhs,"tryfromenv");
      if (bVar4) goto LAB_0010cf08;
      local_100.piece_ = NullSafeStringView("FLAGS_");
      __alloc = (AlphaNum *)__lhs->_M_string_length;
      local_130.piece_._M_str = (__lhs->_M_dataplus)._M_p;
      local_130.piece_._M_len = (size_t)__alloc;
      __n_00 = &local_100;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&envname,__n_00);
      _Var3 = envname._M_dataplus;
      envval._M_dataplus._M_p = (pointer)&envval.field_2;
      envval._M_string_length = 0;
      envval.field_2._M_local_buf[0] = '\0';
      pcVar5 = getenv(envname._M_dataplus._M_p);
      if (pcVar5 == (char *)0x0) {
        local_174 = (char)input_args;
        if (local_174 != '\0') {
          local_100.piece_._M_str = _Var3._M_p;
          local_100.piece_._M_len = envname._M_string_length;
          local_130.piece_ = NullSafeStringView(" not found in environment");
          absl::lts_20240722::StrCat_abi_cxx11_(&local_d0,&local_100);
          __n_00 = (AlphaNum *)local_d0.piece_._M_len;
          absl::lts_20240722::flags_internal::ReportUsageError
                    (local_d0.piece_._M_str,local_d0.piece_._M_len,1);
          std::__cxx11::string::~string((string *)&local_d0);
          bVar8 = false;
        }
      }
      else {
        std::__cxx11::string::assign((char *)&envval);
        local_100.piece_ = NullSafeStringView("--");
        local_130.piece_._M_str = (__lhs->_M_dataplus)._M_p;
        local_130.piece_._M_len = __lhs->_M_string_length;
        local_d0.piece_ = NullSafeStringView("=");
        __alloc = &local_d0;
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)&stack0xffffffffffffffb0,&local_100,&local_130,&local_d0);
        __n_00 = (AlphaNum *)&stack0xffffffffffffffb0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      }
      std::__cxx11::string::~string((string *)&envval);
      std::__cxx11::string::~string((string *)&envname);
      pcVar5 = extraout_RDX_01;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool ReadFlagsFromEnv(const std::vector<std::string>& flag_names,
                      std::vector<ArgsList>& input_args,
                      bool fail_on_absent_in_env) {
  bool success = true;
  std::vector<std::string> args;

  // This argument represents fake argv[0], which should be present in all arg
  // lists.
  args.emplace_back("");

  for (const auto& flag_name : flag_names) {
    // Avoid infinite recursion.
    if (flag_name == "fromenv" || flag_name == "tryfromenv") {
      flags_internal::ReportUsageError(
          absl::StrCat("Infinite recursion on flag ", flag_name), true);

      success = false;
      continue;
    }

    const std::string envname = absl::StrCat("FLAGS_", flag_name);
    std::string envval;
    if (!GetEnvVar(envname.c_str(), envval)) {
      if (fail_on_absent_in_env) {
        flags_internal::ReportUsageError(
            absl::StrCat(envname, " not found in environment"), true);

        success = false;
      }

      continue;
    }

    args.push_back(absl::StrCat("--", flag_name, "=", envval));
  }

  if (success) {
    input_args.emplace_back(args);
  }

  return success;
}